

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

MakeNet * __thiscall notch::core::MakeNet::addLoss(MakeNet *this,LayerType lt)

{
  undefined1 local_50 [8];
  MakeLayer mk;
  LayerType lt_local;
  MakeNet *this_local;
  
  mk.maybeActivation._4_4_ = lt;
  checkConfig(this);
  MakeLayer::MakeLayer((MakeLayer *)local_50,this->nOutputs);
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,(MakeLayer *)local_50);
  std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
  push_back(&this->layerTypes,(value_type *)((long)&mk.maybeActivation + 4));
  this->nOutputs = 0;
  this->hasLoss = true;
  MakeLayer::~MakeLayer((MakeLayer *)local_50);
  return this;
}

Assistant:

MakeNet &addLoss(LayerType lt) {
        checkConfig();
        MakeLayer mk(nOutputs);
        layerMakers.push_back(mk);
        layerTypes.push_back(lt);
        nOutputs = 0;
        hasLoss = true;
        return *this;
    }